

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBoxShape.cpp
# Opt level: O1

void __thiscall cbtBoxShape::cbtBoxShape(cbtBoxShape *this,cbtVector3 *boxHalfExtents)

{
  float fVar1;
  undefined1 auVar2 [16];
  
  cbtPolyhedralConvexShape::cbtPolyhedralConvexShape(&this->super_cbtPolyhedralConvexShape);
  (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape._vptr_cbtCollisionShape =
       (_func_int **)&PTR__cbtPolyhedralConvexShape_00b71328;
  (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.super_cbtConvexShape.
  super_cbtCollisionShape.m_shapeType = 0;
  fVar1 = (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_collisionMargin;
  auVar2 = vinsertps_avx(ZEXT416((uint)(boxHalfExtents->m_floats[0] *
                                        *(float *)&(this->super_cbtPolyhedralConvexShape).
                                                   super_cbtConvexInternalShape.super_cbtConvexShape
                                                   .super_cbtCollisionShape.field_0x1c - fVar1)),
                         ZEXT416((uint)(boxHalfExtents->m_floats[1] *
                                        *(float *)&(this->super_cbtPolyhedralConvexShape).
                                                   super_cbtConvexInternalShape.field_0x20 - fVar1))
                         ,0x10);
  auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)(boxHalfExtents->m_floats[2] *
                                               *(float *)&(this->super_cbtPolyhedralConvexShape).
                                                          super_cbtConvexInternalShape.field_0x24 -
                                              fVar1)),0x28);
  *(undefined1 (*) [16])
   (this->super_cbtPolyhedralConvexShape).super_cbtConvexInternalShape.m_implicitShapeDimensions.
   m_floats = auVar2;
  cbtConvexInternalShape::setSafeMargin((cbtConvexInternalShape *)this,boxHalfExtents,0.1);
  return;
}

Assistant:

cbtBoxShape::cbtBoxShape(const cbtVector3& boxHalfExtents)
	: cbtPolyhedralConvexShape()
{
	m_shapeType = BOX_SHAPE_PROXYTYPE;

	cbtVector3 margin(getMargin(), getMargin(), getMargin());
	m_implicitShapeDimensions = (boxHalfExtents * m_localScaling) - margin;

	setSafeMargin(boxHalfExtents);
}